

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O2

void mserialize::detail::BuiltinSerializer<std::__cxx11::list<int,_std::allocator<int>_>,_void>::
     serialize_elems<OutputStream>(long *param_1,undefined8 param_2,OutputStream *param_3)

{
  list<int,_std::allocator<int>_> *__range3;
  long *plVar1;
  
  plVar1 = param_1;
  while (plVar1 = (long *)*plVar1, plVar1 != param_1) {
    serialize<int,OutputStream>((int *)(plVar1 + 2),param_3);
  }
  return;
}

Assistant:

static void serialize_elems(
    std::false_type /* no batch copy */,
    const Sequence& s, std::uint32_t /* size */, OutputStream& ostream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::serialize<value_type>(elem, ostream);
    }
  }